

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkClearance.cpp
# Opt level: O2

void __thiscall chrono::ChLinkClearance::ChLinkClearance(ChLinkClearance *this)

{
  ChLinkLimit *pCVar1;
  undefined1 auVar2 [16];
  double dVar3;
  
  ChLinkLockLock::ChLinkLockLock(&this->super_ChLinkLockLock);
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj._vptr_ChObj = &PTR__ChLinkLockLock_01166918;
  (this->contact_F_abs).m_data[0] = 0.0;
  (this->contact_F_abs).m_data[1] = 0.0;
  (this->contact_F_abs).m_data[2] = 0.0;
  (this->contact_V_abs).m_data[0] = 0.0;
  (this->contact_F_abs).m_data[2] = 0.0;
  (this->contact_V_abs).m_data[0] = 0.0;
  (this->contact_V_abs).m_data[1] = 0.0;
  (this->contact_V_abs).m_data[2] = 0.0;
  (this->super_ChLinkLockLock).super_ChLinkLock.type = CLEARANCE;
  this->clearance = 0.1;
  this->c_friction = 0.0;
  this->c_restitution = 0.9;
  this->c_tang_restitution = 0.9;
  auVar2 = vmovhps_avx(ZEXT816(0) << 0x40,0x3fe999999999999a);
  this->c_viscous = (double)auVar2._0_8_;
  dVar3 = DAT_011dd3e0;
  this->diameter = (double)auVar2._8_8_;
  if (this != (ChLinkClearance *)(sBulletDNAstr64 + 0x27a8)) {
    (this->contact_F_abs).m_data[0] = VNULL;
    (this->contact_F_abs).m_data[1] = dVar3;
    (this->contact_F_abs).m_data[2] = DAT_011dd3e8;
  }
  dVar3 = DAT_011dd3e0;
  if (this != (ChLinkClearance *)(sBulletDNAstr64 + 0x2790)) {
    (this->contact_V_abs).m_data[0] = VNULL;
    (this->contact_V_abs).m_data[1] = dVar3;
    (this->contact_V_abs).m_data[2] = DAT_011dd3e8;
  }
  pCVar1 = (this->super_ChLinkLockLock).super_ChLinkLock.limit_X._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  pCVar1->m_active = true;
  ChLinkLimit::SetMax(pCVar1,0.1);
  pCVar1 = (this->super_ChLinkLockLock).super_ChLinkLock.limit_X._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  pCVar1->m_maxElastic = this->c_restitution;
  ChLinkLimit::SetMin(pCVar1,-1000.0);
  ChLinkMaskLF::SetLockMask
            (&(this->super_ChLinkLockLock).super_ChLinkLock.mask,false,false,false,false,true,true,
             false);
  ChLinkLock::BuildLink((ChLinkLock *)this);
  return;
}

Assistant:

ChLinkClearance::ChLinkClearance() {
    type = LinkType::CLEARANCE;

    clearance = 0.1;
    c_friction = 0.;
    c_viscous = 0.;
    c_restitution = 0.9;
    c_tang_restitution = 0.9;
    diameter = 0.8;

    contact_F_abs = VNULL;
    contact_V_abs = VNULL;

    this->limit_X->SetActive(true);
    this->limit_X->SetMax(clearance);
    this->limit_X->SetMaxElastic(c_restitution);
    this->limit_X->SetMin(-1000.0);

    // Mask: initialize our LinkMaskLF (lock formulation mask)
    mask.SetLockMask(false, false, false, false, true, true, false);
    BuildLink();
}